

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O0

void __thiscall despot::RegDemo::ComputeDefaultActions(RegDemo *this,string *type)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  const_reference pvVar5;
  reference pvVar6;
  int local_2c;
  int s;
  double value;
  int num_states;
  string *type_local;
  RegDemo *this_local;
  
  poVar4 = std::operator<<((ostream *)&std::cerr,"Default action = ");
  poVar4 = std::operator<<(poVar4,(string *)type);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = std::operator==(type,"MDP");
  if (!bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Unsupported default action type ");
    poVar4 = std::operator<<(poVar4,(string *)type);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  (**(code **)(*(long *)&this->super_MDP + 0x30))(&this->super_MDP);
  iVar3 = (**(code **)(*(long *)this + 0xd0))();
  std::vector<int,_std::allocator<int>_>::resize(&this->default_action_,(long)iVar3);
  for (local_2c = 0; local_2c < iVar3; local_2c = local_2c + 1) {
    pvVar5 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                       ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                        &this->field_0x10,(long)local_2c);
    vVar1 = *(value_type *)pvVar5;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->default_action_,(long)local_2c);
    *pvVar6 = vVar1;
    std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
              ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
               &this->field_0x10,(long)local_2c);
  }
  return;
}

Assistant:

void RegDemo::ComputeDefaultActions(string type) const {
	cerr << "Default action = " << type << endl;
	if (type == "MDP") {
		const_cast<RegDemo*>(this)->ComputeOptimalPolicyUsingVI();
		int num_states = NumStates();
		default_action_.resize(num_states);

		double value = 0;
		for (int s = 0; s < num_states; s++) {
			default_action_[s] = policy_[s].action;
			value += policy_[s].value;
		}
	} else {
		cerr << "Unsupported default action type " << type << endl;
		exit(0);
	}
}